

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O1

void mp3d_synth_granule(float *qmf_state,float *grbuf,int nbands,int nch,mp3d_sample_t *pcm,
                       float *lins)

{
  mp3d_sample_t *pcm_00;
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  long lVar26;
  long lVar27;
  float *pfVar28;
  long lVar29;
  float *pfVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  long local_320;
  long local_308;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  float local_238 [2];
  undefined8 uStack_230;
  float afStack_228 [24];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [28];
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138 [66];
  
  if (0 < nch) {
    pfVar7 = grbuf + 0x10e;
    uVar19 = 0;
    pfVar13 = grbuf;
    do {
      if (0 < nbands) {
        uVar32 = 0;
        pfVar15 = pfVar7;
        pfVar25 = pfVar13;
        do {
          pfVar30 = (float *)&DAT_00166f58;
          lVar17 = 0;
          pfVar28 = pfVar15;
          pfVar35 = pfVar25;
          do {
            fVar55 = *pfVar35 + pfVar28[0x120];
            fVar57 = pfVar35[1] + pfVar28[0x121];
            fVar58 = pfVar35[2] + pfVar28[0x122];
            fVar59 = pfVar35[3] + pfVar28[0x123];
            fVar61 = *pfVar28 + pfVar35[0x120];
            fVar63 = pfVar28[1] + pfVar35[0x121];
            fVar65 = pfVar28[2] + pfVar35[0x122];
            fVar67 = pfVar28[3] + pfVar35[0x123];
            fVar53 = pfVar30[-2];
            fVar75 = pfVar30[-1];
            fVar60 = *pfVar30;
            fVar47 = fVar53 * (*pfVar28 - pfVar35[0x120]);
            fVar49 = fVar53 * (pfVar28[1] - pfVar35[0x121]);
            fVar51 = fVar53 * (pfVar28[2] - pfVar35[0x122]);
            fVar53 = fVar53 * (pfVar28[3] - pfVar35[0x123]);
            fVar69 = fVar75 * (*pfVar35 - pfVar28[0x120]);
            fVar71 = fVar75 * (pfVar35[1] - pfVar28[0x121]);
            fVar73 = fVar75 * (pfVar35[2] - pfVar28[0x122]);
            fVar75 = fVar75 * (pfVar35[3] - pfVar28[0x123]);
            *(float *)((long)local_238 + lVar17) = fVar61 + fVar55;
            *(float *)((long)local_238 + lVar17 + 4) = fVar63 + fVar57;
            *(float *)((long)afStack_228 + lVar17 + -8) = fVar65 + fVar58;
            *(float *)((long)afStack_228 + lVar17 + -4) = fVar67 + fVar59;
            *(float *)((long)local_1b8 + lVar17) = (fVar55 - fVar61) * fVar60;
            *(float *)((long)local_1b8 + lVar17 + 4) = (fVar57 - fVar63) * fVar60;
            *(float *)((long)local_1b8 + lVar17 + 8) = (fVar58 - fVar65) * fVar60;
            *(float *)((long)local_1b8 + lVar17 + 0xc) = (fVar59 - fVar67) * fVar60;
            *(float *)((long)local_138 + lVar17) = fVar47 + fVar69;
            *(float *)((long)local_138 + lVar17 + 4) = fVar49 + fVar71;
            *(float *)((long)local_138 + lVar17 + 8) = fVar51 + fVar73;
            *(float *)((long)local_138 + lVar17 + 0xc) = fVar53 + fVar75;
            *(float *)((long)local_138 + lVar17 + 0x80) = (fVar69 - fVar47) * fVar60;
            *(float *)((long)local_138 + lVar17 + 0x84) = (fVar71 - fVar49) * fVar60;
            *(float *)((long)local_138 + lVar17 + 0x88) = (fVar73 - fVar51) * fVar60;
            *(float *)((long)local_138 + lVar17 + 0x8c) = (fVar75 - fVar53) * fVar60;
            lVar17 = lVar17 + 0x10;
            pfVar30 = pfVar30 + 3;
            pfVar28 = pfVar28 + -0x12;
            pfVar35 = pfVar35 + 0x12;
          } while (lVar17 != 0x80);
          lVar17 = 0;
          do {
            fVar53 = *(float *)((long)local_238 + lVar17 + 4);
            fVar75 = *(float *)((long)afStack_228 + lVar17 + -8);
            fVar60 = *(float *)((long)afStack_228 + lVar17 + -4);
            fVar47 = *(float *)((long)afStack_228 + lVar17 + 4);
            fVar49 = *(float *)((long)afStack_228 + lVar17 + 8);
            fVar51 = *(float *)((long)afStack_228 + lVar17 + 0xc);
            fVar55 = *(float *)((long)afStack_228 + lVar17 + 0x10);
            fVar57 = *(float *)((long)afStack_228 + lVar17 + 0x14);
            fVar58 = *(float *)((long)afStack_228 + lVar17 + 0x18);
            fVar59 = *(float *)((long)afStack_228 + lVar17 + 0x1c);
            fVar61 = *(float *)((long)afStack_228 + lVar17 + 0x20);
            fVar63 = *(float *)((long)afStack_228 + lVar17 + 0x24);
            fVar65 = *(float *)((long)afStack_228 + lVar17 + 0x28);
            fVar67 = *(float *)((long)afStack_228 + lVar17 + 0x2c);
            fVar69 = *(float *)((long)afStack_228 + lVar17 + 0x30);
            fVar71 = *(float *)((long)afStack_228 + lVar17 + 0x34);
            fVar73 = *(float *)((long)afStack_228 + lVar17 + 0x38);
            fVar77 = *(float *)((long)afStack_228 + lVar17 + 0x3c);
            fVar46 = *(float *)((long)afStack_228 + lVar17 + 0x40);
            fVar48 = *(float *)((long)afStack_228 + lVar17 + 0x44);
            fVar50 = *(float *)((long)afStack_228 + lVar17 + 0x48);
            fVar52 = *(float *)((long)afStack_228 + lVar17 + 0x4c);
            fVar42 = *(float *)((long)afStack_228 + lVar17 + 0x50);
            fVar38 = *(float *)((long)afStack_228 + lVar17 + 0x54);
            fVar39 = *(float *)((long)afStack_228 + lVar17 + 0x58);
            fVar40 = *(float *)((long)afStack_228 + lVar17 + 0x5c);
            fVar41 = *(float *)((long)&local_1c8 + lVar17 + 4);
            fVar54 = *(float *)((long)&uStack_1c0 + lVar17 + 4);
            fVar62 = *(float *)((long)local_238 + lVar17) - *(float *)((long)&local_1c8 + lVar17);
            fVar64 = fVar53 - fVar41;
            fVar66 = fVar75 - *(float *)((long)&uStack_1c0 + lVar17);
            fVar68 = fVar60 - fVar54;
            fVar56 = *(float *)((long)local_238 + lVar17) + *(float *)((long)&local_1c8 + lVar17);
            fVar53 = fVar53 + fVar41;
            fVar75 = fVar75 + *(float *)((long)&uStack_1c0 + lVar17);
            fVar60 = fVar60 + fVar54;
            fVar70 = *(float *)((long)afStack_228 + lVar17) - fVar42;
            fVar72 = fVar47 - fVar38;
            fVar74 = fVar49 - fVar39;
            fVar76 = fVar51 - fVar40;
            fVar42 = *(float *)((long)afStack_228 + lVar17) + fVar42;
            fVar47 = fVar47 + fVar38;
            fVar49 = fVar49 + fVar39;
            fVar51 = fVar51 + fVar40;
            fVar38 = fVar55 - fVar46;
            fVar39 = fVar57 - fVar48;
            fVar40 = fVar58 - fVar50;
            fVar41 = fVar59 - fVar52;
            fVar55 = fVar55 + fVar46;
            fVar57 = fVar57 + fVar48;
            fVar58 = fVar58 + fVar50;
            fVar59 = fVar59 + fVar52;
            fVar78 = fVar61 + fVar69;
            fVar79 = fVar63 + fVar71;
            fVar80 = fVar65 + fVar73;
            fVar81 = fVar67 + fVar77;
            fVar48 = fVar56 - fVar78;
            fVar50 = fVar53 - fVar79;
            fVar52 = fVar75 - fVar80;
            fVar54 = fVar60 - fVar81;
            fVar78 = fVar78 + fVar56;
            fVar79 = fVar79 + fVar53;
            fVar80 = fVar80 + fVar75;
            fVar81 = fVar81 + fVar60;
            fVar53 = fVar55 + fVar42;
            fVar75 = fVar57 + fVar47;
            fVar60 = fVar58 + fVar49;
            fVar46 = fVar59 + fVar51;
            *(float *)((long)local_238 + lVar17) = fVar53 + fVar78;
            *(float *)((long)local_238 + lVar17 + 4) = fVar75 + fVar79;
            *(float *)((long)afStack_228 + lVar17 + -8) = fVar60 + fVar80;
            *(float *)((long)afStack_228 + lVar17 + -4) = fVar46 + fVar81;
            *(float *)((long)afStack_228 + lVar17 + 0x30) = (fVar78 - fVar53) * 0.70710677;
            *(float *)((long)afStack_228 + lVar17 + 0x34) = (fVar79 - fVar75) * 0.70710677;
            *(float *)((long)afStack_228 + lVar17 + 0x38) = (fVar80 - fVar60) * 0.70710677;
            *(float *)((long)afStack_228 + lVar17 + 0x3c) = (fVar81 - fVar46) * 0.70710677;
            fVar53 = (fVar38 + fVar70) * 0.70710677;
            fVar75 = (fVar39 + fVar72) * 0.70710677;
            fVar60 = (fVar40 + fVar74) * 0.70710677;
            fVar46 = (fVar41 + fVar76) * 0.70710677;
            fVar70 = fVar70 + fVar62;
            fVar72 = fVar72 + fVar64;
            fVar74 = fVar74 + fVar66;
            fVar76 = fVar76 + fVar68;
            fVar61 = ((fVar61 - fVar69) + fVar38) - fVar70 * 0.19891237;
            fVar63 = ((fVar63 - fVar71) + fVar39) - fVar72 * 0.19891237;
            fVar65 = ((fVar65 - fVar73) + fVar40) - fVar74 * 0.19891237;
            fVar67 = ((fVar67 - fVar77) + fVar41) - fVar76 * 0.19891237;
            fVar70 = fVar61 * 0.38268343 + fVar70;
            fVar72 = fVar63 * 0.38268343 + fVar72;
            fVar74 = fVar65 * 0.38268343 + fVar74;
            fVar76 = fVar67 * 0.38268343 + fVar76;
            fVar69 = fVar62 - fVar53;
            fVar71 = fVar64 - fVar75;
            fVar73 = fVar66 - fVar60;
            fVar77 = fVar68 - fVar46;
            fVar53 = fVar53 + fVar62;
            fVar75 = fVar75 + fVar64;
            fVar60 = fVar60 + fVar66;
            fVar46 = fVar46 + fVar68;
            fVar61 = fVar61 - fVar70 * 0.19891237;
            fVar63 = fVar63 - fVar72 * 0.19891237;
            fVar65 = fVar65 - fVar74 * 0.19891237;
            fVar67 = fVar67 - fVar76 * 0.19891237;
            fVar55 = ((fVar42 - fVar55) + fVar48) * 0.70710677;
            fVar47 = ((fVar47 - fVar57) + fVar50) * 0.70710677;
            fVar49 = ((fVar49 - fVar58) + fVar52) * 0.70710677;
            fVar51 = ((fVar51 - fVar59) + fVar54) * 0.70710677;
            *(float *)((long)afStack_228 + lVar17) = (fVar53 + fVar70) * 0.5097956;
            *(float *)((long)afStack_228 + lVar17 + 4) = (fVar75 + fVar72) * 0.5097956;
            *(float *)((long)afStack_228 + lVar17 + 8) = (fVar60 + fVar74) * 0.5097956;
            *(float *)((long)afStack_228 + lVar17 + 0xc) = (fVar46 + fVar76) * 0.5097956;
            *(float *)((long)afStack_228 + lVar17 + 0x10) = (fVar48 + fVar55) * 0.5411961;
            *(float *)((long)afStack_228 + lVar17 + 0x14) = (fVar50 + fVar47) * 0.5411961;
            *(float *)((long)afStack_228 + lVar17 + 0x18) = (fVar52 + fVar49) * 0.5411961;
            *(float *)((long)afStack_228 + lVar17 + 0x1c) = (fVar54 + fVar51) * 0.5411961;
            *(float *)((long)afStack_228 + lVar17 + 0x20) = (fVar69 - fVar61) * 0.6013449;
            *(float *)((long)afStack_228 + lVar17 + 0x24) = (fVar71 - fVar63) * 0.6013449;
            *(float *)((long)afStack_228 + lVar17 + 0x28) = (fVar73 - fVar65) * 0.6013449;
            *(float *)((long)afStack_228 + lVar17 + 0x2c) = (fVar77 - fVar67) * 0.6013449;
            *(float *)((long)afStack_228 + lVar17 + 0x40) = (fVar69 + fVar61) * 0.8999762;
            *(float *)((long)afStack_228 + lVar17 + 0x44) = (fVar71 + fVar63) * 0.8999762;
            *(float *)((long)afStack_228 + lVar17 + 0x48) = (fVar73 + fVar65) * 0.8999762;
            *(float *)((long)afStack_228 + lVar17 + 0x4c) = (fVar77 + fVar67) * 0.8999762;
            *(float *)((long)afStack_228 + lVar17 + 0x50) = (fVar48 - fVar55) * 1.306563;
            *(float *)((long)afStack_228 + lVar17 + 0x54) = (fVar50 - fVar47) * 1.306563;
            *(float *)((long)afStack_228 + lVar17 + 0x58) = (fVar52 - fVar49) * 1.306563;
            *(float *)((long)afStack_228 + lVar17 + 0x5c) = (fVar54 - fVar51) * 1.306563;
            *(float *)((long)&local_1c8 + lVar17) = (fVar53 - fVar70) * 2.5629156;
            *(float *)((long)&local_1c8 + lVar17 + 4) = (fVar75 - fVar72) * 2.5629156;
            *(float *)((long)&uStack_1c0 + lVar17) = (fVar60 - fVar74) * 2.5629156;
            *(float *)((long)&uStack_1c0 + lVar17 + 4) = (fVar46 - fVar76) * 2.5629156;
            lVar17 = lVar17 + 0x80;
          } while ((int)lVar17 != 0x200);
          lVar17 = 0;
          pfVar28 = local_138 + 0x24;
          if ((long)(nbands + -3) < (long)uVar32) {
            do {
              fVar53 = pfVar28[-4];
              fVar75 = pfVar28[-3];
              fVar60 = *pfVar28;
              fVar47 = pfVar28[1];
              *(undefined8 *)((long)pfVar25 + lVar17) = *(undefined8 *)(pfVar28 + -100);
              *(ulong *)((long)pfVar25 + lVar17 + 0x48) =
                   CONCAT44(pfVar28[-0x23] + fVar75 + fVar47,pfVar28[-0x24] + fVar53 + fVar60);
              *(ulong *)((long)pfVar25 + lVar17 + 0x90) =
                   CONCAT44(pfVar28[-0x43] + pfVar28[-0x3f],pfVar28[-0x44] + pfVar28[-0x40]);
              *(ulong *)((long)pfVar25 + lVar17 + 0xd8) =
                   CONCAT44(fVar75 + fVar47 + pfVar28[-0x1f],fVar53 + fVar60 + pfVar28[-0x20]);
              pfVar28 = pfVar28 + 4;
              lVar17 = lVar17 + 0x120;
            } while (lVar17 != 0x7e0);
            *(undefined8 *)(pfVar25 + 0x1f8) = local_1c8;
            *(ulong *)(pfVar25 + 0x20a) =
                 CONCAT44(local_138[0x1d] + local_138[0x3d],local_138[0x1c] + local_138[0x3c]);
            *(undefined8 *)(pfVar25 + 0x21c) = local_148;
            pfVar25[0x22e] = local_138[0x3c];
            pfVar25[0x22f] = local_138[0x3d];
          }
          else {
            do {
              fVar53 = pfVar28[-4];
              fVar75 = pfVar28[-3];
              fVar60 = pfVar28[-2];
              fVar47 = pfVar28[-1];
              fVar49 = *pfVar28;
              fVar51 = pfVar28[1];
              fVar55 = pfVar28[2];
              fVar57 = pfVar28[3];
              uVar3 = *(undefined8 *)(pfVar28 + -0x62);
              *(undefined8 *)((long)pfVar25 + lVar17) = *(undefined8 *)(pfVar28 + -100);
              ((undefined8 *)((long)pfVar25 + lVar17))[1] = uVar3;
              fVar58 = pfVar28[-0x23];
              fVar59 = pfVar28[-0x22];
              fVar61 = pfVar28[-0x21];
              pfVar35 = (float *)((long)pfVar25 + lVar17 + 0x48);
              *pfVar35 = pfVar28[-0x24] + fVar53 + fVar49;
              pfVar35[1] = fVar58 + fVar75 + fVar51;
              pfVar35[2] = fVar59 + fVar60 + fVar55;
              pfVar35[3] = fVar61 + fVar47 + fVar57;
              fVar58 = pfVar28[-0x43];
              fVar59 = pfVar28[-0x42];
              fVar61 = pfVar28[-0x41];
              fVar63 = pfVar28[-0x3f];
              fVar65 = pfVar28[-0x3e];
              fVar67 = pfVar28[-0x3d];
              pfVar35 = (float *)((long)pfVar25 + lVar17 + 0x90);
              *pfVar35 = pfVar28[-0x44] + pfVar28[-0x40];
              pfVar35[1] = fVar58 + fVar63;
              pfVar35[2] = fVar59 + fVar65;
              pfVar35[3] = fVar61 + fVar67;
              fVar58 = pfVar28[-0x1f];
              fVar59 = pfVar28[-0x1e];
              fVar61 = pfVar28[-0x1d];
              pfVar35 = (float *)((long)pfVar25 + lVar17 + 0xd8);
              *pfVar35 = fVar53 + fVar49 + pfVar28[-0x20];
              pfVar35[1] = fVar75 + fVar51 + fVar58;
              pfVar35[2] = fVar60 + fVar55 + fVar59;
              pfVar35[3] = fVar47 + fVar57 + fVar61;
              pfVar28 = pfVar28 + 4;
              lVar17 = lVar17 + 0x120;
            } while (lVar17 != 0x7e0);
            *(undefined8 *)(pfVar25 + 0x1f8) = local_1c8;
            *(undefined8 *)(pfVar25 + 0x1fa) = uStack_1c0;
            pfVar25[0x20a] = local_138[0x1c] + local_138[0x3c];
            pfVar25[0x20b] = local_138[0x1d] + local_138[0x3d];
            pfVar25[0x20c] = local_138[0x1e] + local_138[0x3e];
            pfVar25[0x20d] = local_138[0x1f] + local_138[0x3f];
            *(undefined8 *)(pfVar25 + 0x21c) = local_148;
            *(undefined8 *)(pfVar25 + 0x21e) = uStack_140;
            pfVar25[0x22e] = local_138[0x3c];
            pfVar25[0x22f] = local_138[0x3d];
            pfVar25[0x230] = local_138[0x3e];
            pfVar25[0x231] = local_138[0x3f];
          }
          uVar32 = uVar32 + 4;
          pfVar15 = pfVar15 + 4;
          pfVar25 = pfVar25 + 4;
        } while (uVar32 < (uint)nbands);
      }
      uVar19 = uVar19 + 1;
      pfVar7 = pfVar7 + 0x240;
      pfVar13 = pfVar13 + 0x240;
    } while (uVar19 != (uint)nch);
  }
  memcpy(lins,qmf_state,0xf00);
  if (0 < nbands) {
    lVar12 = (long)nch;
    lVar9 = (long)(nch * 0x240 + -0x240);
    lVar6 = (long)(nch << 5);
    lVar2 = lVar12 * 2;
    lVar22 = lVar12 * 0x7e;
    lVar1 = lVar6 * 4;
    lVar14 = lVar12 * 4 + -2;
    lVar23 = lVar12 * 0x80 + -2;
    lVar36 = lVar12 * 0x42;
    lVar16 = lVar12 * 0x44 + -2;
    lVar27 = lVar12 * 0x3e;
    lVar33 = lVar12 * 0x40 + -2;
    lVar17 = lVar9 + 0x10f;
    pfVar7 = lins + 0x439;
    lVar10 = lVar9 + 0x133;
    lVar31 = 0x43c;
    lVar18 = 0x4cc;
    uVar19 = 0;
    local_308 = lVar2;
    do {
      pfVar13 = grbuf + uVar19;
      pcm_00 = pcm + uVar19 * lVar6;
      pfVar15 = lins + uVar19 * 0x40 + 0x3c;
      pfVar15[0x3c0] = pfVar13[0x120];
      pfVar15[0x3c1] = pfVar13[lVar9 + 0x120];
      pfVar15[0x3c2] = *pfVar13;
      pfVar15[0x3c3] = pfVar13[lVar9];
      pfVar15[0x400] = pfVar13[0x121];
      pfVar15[0x401] = pfVar13[lVar9 + 0x121];
      pfVar15[0x402] = pfVar13[1];
      pfVar15[0x403] = pfVar13[lVar9 + 1];
      mp3d_synth_pair(pcm_00 + lVar12 + -1,nch,lins + uVar19 * 0x40 + 0x3d);
      mp3d_synth_pair(pcm_00 + lVar12 + -1 + lVar6,nch,lins + uVar19 * 0x40 + 0x7d);
      mp3d_synth_pair(pcm_00,nch,pfVar15);
      mp3d_synth_pair(pcm_00 + lVar6,nch,lins + uVar19 * 0x40 + 0x7c);
      auVar5 = _DAT_001654f0;
      auVar4 = _DAT_001654e0;
      local_320 = local_308;
      lVar29 = 0;
      lVar8 = lVar18;
      lVar11 = lVar31;
      pfVar13 = pfVar7;
      lVar20 = lVar22;
      lVar21 = lVar36;
      lVar24 = lVar10;
      lVar26 = lVar17;
      lVar34 = lVar14;
      local_298 = lVar23;
      local_290 = lVar16;
      local_288 = lVar27;
      local_280 = lVar33;
      do {
        pfVar13[-0x41] = *(float *)((long)grbuf + lVar8 + -4);
        pfVar13[-0x40] = grbuf[lVar24 + -1];
        pfVar13[-0x3f] = *(float *)((long)grbuf + lVar8);
        pfVar13[-0x3e] = grbuf[lVar24];
        pfVar13[-1] = *(float *)((long)grbuf + lVar11);
        *pfVar13 = grbuf[lVar26];
        pfVar13[-0x7f] = *(float *)((long)grbuf + lVar11 + -4);
        pfVar13[-0x7e] = grbuf[lVar26 + -1];
        fVar53 = *(float *)((long)&mp3d_synth_g_win + lVar29);
        fVar75 = *(float *)((long)&DAT_00166fb4 + lVar29);
        fVar60 = *(float *)((long)&DAT_00166fb8 + lVar29);
        fVar47 = *(float *)((long)&DAT_00166fbc + lVar29);
        fVar49 = *(float *)((long)&DAT_00166fc0 + lVar29);
        fVar51 = *(float *)((long)&DAT_00166fc4 + lVar29);
        fVar55 = *(float *)((long)&DAT_00166fc8 + lVar29);
        fVar57 = *(float *)((long)&DAT_00166fcc + lVar29);
        fVar58 = *(float *)((long)&DAT_00166fd0 + lVar29);
        fVar59 = *(float *)((long)&DAT_00166fd4 + lVar29);
        fVar61 = *(float *)((long)&DAT_00166fd8 + lVar29);
        fVar63 = *(float *)((long)&DAT_00166fdc + lVar29);
        fVar65 = *(float *)((long)&DAT_00166fe0 + lVar29);
        fVar67 = *(float *)((long)&DAT_00166fe4 + lVar29);
        fVar69 = *(float *)((long)&DAT_00166fe8 + lVar29);
        fVar71 = *(float *)((long)&DAT_00166fec + lVar29);
        auVar43._0_4_ =
             fVar69 * pfVar13[-0x241] + pfVar13[-0x201] * fVar71 +
             fVar65 * pfVar13[-0x281] + pfVar13[-0x1c1] * fVar67 +
             fVar61 * pfVar13[-0x2c1] + pfVar13[-0x181] * fVar63 +
             fVar58 * pfVar13[-0x301] + pfVar13[-0x141] * fVar59 +
             fVar55 * pfVar13[-0x341] + pfVar13[-0x101] * fVar57 +
             fVar49 * pfVar13[-0x381] + pfVar13[-0xc1] * fVar51 +
             fVar60 * pfVar13[-0x3c1] + pfVar13[-0x81] * fVar47 +
             fVar53 * pfVar13[-0x401] + pfVar13[-0x41] * fVar75;
        auVar43._4_4_ =
             fVar69 * pfVar13[-0x240] + pfVar13[-0x200] * fVar71 +
             fVar65 * pfVar13[-0x280] + pfVar13[-0x1c0] * fVar67 +
             fVar61 * pfVar13[-0x2c0] + pfVar13[-0x180] * fVar63 +
             fVar58 * pfVar13[-0x300] + pfVar13[-0x140] * fVar59 +
             fVar55 * pfVar13[-0x340] + pfVar13[-0x100] * fVar57 +
             fVar49 * pfVar13[-0x380] + pfVar13[-0xc0] * fVar51 +
             fVar60 * pfVar13[-0x3c0] + pfVar13[-0x80] * fVar47 +
             fVar53 * pfVar13[-0x400] + pfVar13[-0x40] * fVar75;
        auVar43._8_4_ =
             fVar69 * pfVar13[-0x23f] + pfVar13[-0x1ff] * fVar71 +
             fVar65 * pfVar13[-0x27f] + pfVar13[-0x1bf] * fVar67 +
             fVar61 * pfVar13[-0x2bf] + pfVar13[-0x17f] * fVar63 +
             fVar58 * pfVar13[-0x2ff] + pfVar13[-0x13f] * fVar59 +
             fVar55 * pfVar13[-0x33f] + pfVar13[-0xff] * fVar57 +
             fVar49 * pfVar13[-0x37f] + pfVar13[-0xbf] * fVar51 +
             fVar60 * pfVar13[-0x3bf] + pfVar13[-0x7f] * fVar47 +
             fVar53 * pfVar13[-0x3ff] + pfVar13[-0x3f] * fVar75;
        auVar43._12_4_ =
             fVar69 * pfVar13[-0x23e] + pfVar13[-0x1fe] * fVar71 +
             fVar65 * pfVar13[-0x27e] + pfVar13[-0x1be] * fVar67 +
             fVar61 * pfVar13[-0x2be] + pfVar13[-0x17e] * fVar63 +
             fVar58 * pfVar13[-0x2fe] + pfVar13[-0x13e] * fVar59 +
             fVar55 * pfVar13[-0x33e] + pfVar13[-0xfe] * fVar57 +
             fVar49 * pfVar13[-0x37e] + pfVar13[-0xbe] * fVar51 +
             fVar60 * pfVar13[-0x3be] + pfVar13[-0x7e] * fVar47 +
             fVar53 * pfVar13[-0x3fe] + pfVar13[-0x3e] * fVar75;
        auVar45._0_4_ =
             (fVar71 * pfVar13[-0x241] - pfVar13[-0x201] * fVar69) +
             (pfVar13[-0x1c1] * fVar65 - fVar67 * pfVar13[-0x281]) +
             (fVar63 * pfVar13[-0x2c1] - pfVar13[-0x181] * fVar61) +
             (pfVar13[-0x141] * fVar58 - fVar59 * pfVar13[-0x301]) +
             (fVar57 * pfVar13[-0x341] - pfVar13[-0x101] * fVar55) +
             (pfVar13[-0xc1] * fVar49 - fVar51 * pfVar13[-0x381]) +
             (fVar47 * pfVar13[-0x3c1] - pfVar13[-0x81] * fVar60) +
             (pfVar13[-0x41] * fVar53 - fVar75 * pfVar13[-0x401]);
        auVar45._4_4_ =
             (fVar71 * pfVar13[-0x240] - pfVar13[-0x200] * fVar69) +
             (pfVar13[-0x1c0] * fVar65 - fVar67 * pfVar13[-0x280]) +
             (fVar63 * pfVar13[-0x2c0] - pfVar13[-0x180] * fVar61) +
             (pfVar13[-0x140] * fVar58 - fVar59 * pfVar13[-0x300]) +
             (fVar57 * pfVar13[-0x340] - pfVar13[-0x100] * fVar55) +
             (pfVar13[-0xc0] * fVar49 - fVar51 * pfVar13[-0x380]) +
             (fVar47 * pfVar13[-0x3c0] - pfVar13[-0x80] * fVar60) +
             (pfVar13[-0x40] * fVar53 - fVar75 * pfVar13[-0x400]);
        auVar45._8_4_ =
             (fVar71 * pfVar13[-0x23f] - pfVar13[-0x1ff] * fVar69) +
             (pfVar13[-0x1bf] * fVar65 - fVar67 * pfVar13[-0x27f]) +
             (fVar63 * pfVar13[-0x2bf] - pfVar13[-0x17f] * fVar61) +
             (pfVar13[-0x13f] * fVar58 - fVar59 * pfVar13[-0x2ff]) +
             (fVar57 * pfVar13[-0x33f] - pfVar13[-0xff] * fVar55) +
             (pfVar13[-0xbf] * fVar49 - fVar51 * pfVar13[-0x37f]) +
             (fVar47 * pfVar13[-0x3bf] - pfVar13[-0x7f] * fVar60) +
             (pfVar13[-0x3f] * fVar53 - fVar75 * pfVar13[-0x3ff]);
        auVar45._12_4_ =
             (fVar71 * pfVar13[-0x23e] - pfVar13[-0x1fe] * fVar69) +
             (pfVar13[-0x1be] * fVar65 - fVar67 * pfVar13[-0x27e]) +
             (fVar63 * pfVar13[-0x2be] - pfVar13[-0x17e] * fVar61) +
             (pfVar13[-0x13e] * fVar58 - fVar59 * pfVar13[-0x2fe]) +
             (fVar57 * pfVar13[-0x33e] - pfVar13[-0xfe] * fVar55) +
             (pfVar13[-0xbe] * fVar49 - fVar51 * pfVar13[-0x37e]) +
             (fVar47 * pfVar13[-0x3be] - pfVar13[-0x7e] * fVar60) +
             (pfVar13[-0x3e] * fVar53 - fVar75 * pfVar13[-0x3fe]);
        auVar44 = minps(auVar45,auVar4);
        auVar45 = maxps(auVar44,auVar5);
        auVar44 = minps(auVar43,auVar4);
        auVar43 = maxps(auVar44,auVar5);
        auVar37._0_4_ = (int)auVar45._0_4_;
        auVar37._4_4_ = (int)auVar45._4_4_;
        auVar37._8_4_ = (int)auVar45._8_4_;
        auVar37._12_4_ = (int)auVar45._12_4_;
        auVar44._4_4_ = (int)auVar43._4_4_;
        auVar44._0_4_ = (int)auVar43._0_4_;
        auVar44._8_4_ = (int)auVar43._8_4_;
        auVar44._12_4_ = (int)auVar43._12_4_;
        auVar44 = packssdw(auVar37,auVar44);
        *(short *)((long)pcm + lVar34) = auVar44._2_2_;
        *(short *)((long)pcm + local_280) = auVar44._10_2_;
        *(short *)((long)pcm + local_320) = auVar44._0_2_;
        *(short *)((long)pcm + local_288) = auVar44._8_2_;
        *(short *)((long)pcm + local_290) = auVar44._6_2_;
        *(short *)((long)pcm + local_298) = auVar44._14_2_;
        *(short *)((long)pcm + lVar21) = auVar44._4_2_;
        *(short *)((long)pcm + lVar20) = auVar44._12_2_;
        lVar29 = lVar29 + 0x40;
        lVar20 = lVar20 + lVar12 * -2;
        local_298 = local_298 + lVar12 * -2;
        lVar21 = lVar21 + lVar2;
        local_290 = local_290 + lVar2;
        local_288 = local_288 + lVar12 * -2;
        local_280 = local_280 + lVar12 * -2;
        local_320 = local_320 + lVar2;
        lVar26 = lVar26 + -0x12;
        lVar11 = lVar11 + -0x48;
        lVar34 = lVar34 + lVar2;
        pfVar13 = pfVar13 + -4;
        lVar24 = lVar24 + 0x12;
        lVar8 = lVar8 + 0x48;
      } while (lVar29 != 0x3c0);
      uVar19 = uVar19 + 2;
      lVar22 = lVar22 + lVar1;
      lVar23 = lVar23 + lVar1;
      lVar36 = lVar36 + lVar1;
      lVar16 = lVar16 + lVar1;
      lVar27 = lVar27 + lVar1;
      lVar33 = lVar33 + lVar1;
      local_308 = local_308 + lVar1;
      lVar14 = lVar14 + lVar1;
      lVar17 = lVar17 + 2;
      lVar31 = lVar31 + 8;
      pfVar7 = pfVar7 + 0x80;
      lVar10 = lVar10 + 2;
      lVar18 = lVar18 + 8;
    } while (uVar19 < (uint)nbands);
  }
  if (nch == 1) {
    uVar19 = 0xfffffffffffffffe;
    do {
      qmf_state[uVar19 + 2] = lins[(ulong)(uint)(nbands << 6) + uVar19 + 2];
      uVar19 = uVar19 + 2;
    } while (uVar19 < 0x3be);
    return;
  }
  memcpy(qmf_state,lins + (uint)(nbands << 6),0xf00);
  return;
}

Assistant:

static void mp3d_synth_granule(float *qmf_state, float *grbuf, int nbands, int nch, mp3d_sample_t *pcm, float *lins)
{
    int i;
    for (i = 0; i < nch; i++)
    {
        mp3d_DCT_II(grbuf + 576*i, nbands);
    }

    memcpy(lins, qmf_state, sizeof(float)*15*64);

    for (i = 0; i < nbands; i += 2)
    {
        mp3d_synth(grbuf + i, pcm + 32*nch*i, nch, lins + i*64);
    }
#ifndef MINIMP3_NONSTANDARD_BUT_LOGICAL
    if (nch == 1)
    {
        for (i = 0; i < 15*64; i += 2)
        {
            qmf_state[i] = lins[nbands*64 + i];
        }
    } else
#endif /* MINIMP3_NONSTANDARD_BUT_LOGICAL */
    {
        memcpy(qmf_state, lins + nbands*64, sizeof(float)*15*64);
    }
}